

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetMacContentDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_90;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined8 local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_28;
  
  GetDirectory(&local_90,this,config,artifact);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = &DAT_00000001;
  local_70.field_2._M_local_buf[0] = '/';
  local_40._M_len = local_90._M_string_length;
  local_40._M_str = local_90._M_dataplus._M_p;
  local_30 = 1;
  views._M_len = 2;
  views._M_array = &local_40;
  local_70._M_string_length = (size_type)paVar1;
  local_28 = paVar1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  bVar2 = IsFrameworkOnApple(this);
  BuildBundleDirectory(&local_70,this,__return_storage_ptr__,config,bVar2 + ContentLevel);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetMacContentDirectory(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  // Start with the output directory for the target.
  std::string fpath = cmStrCat(this->GetDirectory(config, artifact), '/');
  BundleDirectoryLevel level = ContentLevel;
  if (this->IsFrameworkOnApple()) {
    // additional files with a framework go into the version specific
    // directory
    level = FullLevel;
  }
  fpath = this->BuildBundleDirectory(fpath, config, level);
  return fpath;
}